

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O2

void dill_dealloc_specific(dill_stream_conflict s,dill_reg reg,int type,int class)

{
  long *plVar1;
  private_ctx pdVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = 1L << ((byte)reg & 0x3f);
  bVar3 = (byte)reg & 0x3f;
  uVar5 = -2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3;
  pdVar2 = s->p;
  if (1 < type - 9U) {
    if (class != 0) {
      plVar1 = (pdVar2->tmp_i).avail;
      *plVar1 = *plVar1 & uVar5;
      return;
    }
    plVar1 = (pdVar2->var_i).avail;
    *plVar1 = *plVar1 & uVar5;
    plVar1 = (pdVar2->var_i).mustsave;
    *plVar1 = *plVar1 | uVar4;
    return;
  }
  if (class != 0) {
    plVar1 = (pdVar2->tmp_f).avail;
    *plVar1 = *plVar1 & uVar5;
    return;
  }
  plVar1 = (pdVar2->var_f).avail;
  *plVar1 = *plVar1 & uVar5;
  plVar1 = (pdVar2->var_f).mustsave;
  *plVar1 = *plVar1 | uVar4;
  return;
}

Assistant:

extern void
dill_dealloc_specific(dill_stream s, dill_reg reg, int type, int class)
{
    switch (type) {
    case DILL_D:
    case DILL_F:
        if (class == DILL_VAR) {
            RESET_BIT(reg, s->p->var_f.avail);
            SET_BIT(reg, s->p->var_f.mustsave);
        } else {
            RESET_BIT(reg, s->p->tmp_f.avail);
        }
        break;
    default:
        if (class == DILL_VAR) {
            RESET_BIT(reg, s->p->var_i.avail);
            SET_BIT(reg, s->p->var_i.mustsave);
        } else {
            RESET_BIT(reg, s->p->tmp_i.avail);
        }
        break;
    }
}